

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void scaling_clear(CUPDLPscaling *scaling)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      free(*(void **)((long)in_RDI + 0x10));
      *(undefined8 *)((long)in_RDI + 0x10) = 0;
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
      *(undefined8 *)((long)in_RDI + 8) = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void scaling_clear(CUPDLPscaling *scaling) {
  if (scaling) {
    if (scaling->colScale) {
      cupdlp_free(scaling->colScale);
    }
    if (scaling->rowScale) {
      cupdlp_free(scaling->rowScale);
    }
    cupdlp_free(scaling);
  }
}